

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::SetNew(SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
         *this,SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  undefined8 *in_FS_OFFSET;
  
  if (this->endAddress != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x96,"(this->endAddress == nullptr)","this->endAddress == nullptr");
    if (!bVar3) goto LAB_002b6bec;
    *puVar1 = 0;
  }
  if (this->heapBlock !=
      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x97,"(this->heapBlock == nullptr)","this->heapBlock == nullptr");
    if (!bVar3) goto LAB_002b6bec;
    *puVar1 = 0;
  }
  if (this->freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x98,"(this->freeObjectList == nullptr)","this->freeObjectList == nullptr");
    if (!bVar3) goto LAB_002b6bec;
    *puVar1 = 0;
  }
  if (heapBlock == (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9a,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar3) goto LAB_002b6bec;
    *puVar1 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9b,"(heapBlock->freeObjectList == nullptr)",
                       "heapBlock->freeObjectList == nullptr");
    if (!bVar3) goto LAB_002b6bec;
    *puVar1 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.lastFreeCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9c,"(heapBlock->lastFreeCount != 0)","heapBlock->lastFreeCount != 0");
    if (!bVar3) goto LAB_002b6bec;
    *puVar1 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9e,"(!heapBlock->isInAllocator)","!heapBlock->isInAllocator");
    if (!bVar3) {
LAB_002b6bec:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  (heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator = true;
  this->heapBlock = heapBlock;
  this->freeObjectList =
       (FreeObject *)
       (heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
       super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.address;
  pcVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetEndAddress
                     ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  this->endAddress = pcVar4;
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::SetNew(BlockType * heapBlock)
{
    Assert(this->endAddress == nullptr);
    Assert(this->heapBlock == nullptr);
    Assert(this->freeObjectList == nullptr);

    Assert(heapBlock != nullptr);
    Assert(heapBlock->freeObjectList == nullptr);
    Assert(heapBlock->lastFreeCount != 0);

    Assert(!heapBlock->isInAllocator);
    heapBlock->isInAllocator = true;

    this->heapBlock = heapBlock;
    this->freeObjectList = (FreeObject *)heapBlock->GetAddress();
    this->endAddress = heapBlock->GetEndAddress();

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = true);
#endif
}